

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::handleUnexpectedEOF(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  int in_ESI;
  QObject *obj;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < *(int *)(this + 0x5c)) {
    bVar5 = QHttpNetworkRequest::methodIsIdempotent((QHttpNetworkRequest *)(this + 0x28));
    if (bVar5) {
      *(int *)(this + 0x5c) = *(int *)(this + 0x5c) + -1;
      QHttpNetworkReplyPrivate::clear(*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
      QWeakPointer<QObject>::operator=
                ((QWeakPointer<QObject> *)(*(long *)(*(long *)(this + 0x38) + 8) + 0x168),
                 (QWeakPointer<QObject> *)(this + 0xf0));
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(*(long *)(*(long *)(this + 0x38) + 8) + 0x178),
                 (QObject *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        closeAndResendCurrentRequest(this);
        return;
      }
      goto LAB_001f0304;
    }
  }
  requeueCurrentlyPipelinedRequests(this);
  close(this,in_ESI);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QHttpNetworkConnectionPrivate::errorDetail
            ((QString *)&local_48,*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
             RemoteHostClosedError,*(QIODevice **)(this + 0x10),(QString *)&local_68);
  lVar1 = *(long *)(*(long *)(this + 0x38) + 8);
  pDVar3 = *(Data **)(lVar1 + 0xf0);
  pcVar4 = *(char16_t **)(lVar1 + 0xf8);
  *(Data **)(lVar1 + 0xf0) = local_48.d;
  *(char16_t **)(lVar1 + 0xf8) = local_48.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x100);
  *(qsizetype *)(lVar1 + 0x100) = local_48.size;
  local_48.d = pDVar3;
  local_48.ptr = pcVar4;
  local_48.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QHttpNetworkReply::finishedWithError
            (*(QHttpNetworkReply **)(this + 0x38),RemoteHostClosedError,
             (QString *)(*(long *)(*(QHttpNetworkReply **)(this + 0x38) + 8) + 0xf0));
  *(undefined8 *)(this + 0x38) = 0;
  if (*(QAbstractProtocolHandler **)(this + 0x78) != (QAbstractProtocolHandler *)0x0) {
    QAbstractProtocolHandler::setReply
              (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
  }
  QUrl::QUrl((QUrl *)&local_68);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)&local_48,(QUrl *)&local_68,Get,NormalPriority);
  QHttpNetworkRequest::operator=
            ((QHttpNetworkRequest *)(this + 0x28),(QHttpNetworkRequest *)&local_48);
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)&local_48);
  QUrl::~QUrl((QUrl *)&local_68);
  if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
    obj = (QObject *)0x0;
  }
  else {
    obj = *(QObject **)(this + 0xf8);
  }
  QMetaObject::invokeMethod<>(obj,"_q_startNextRequest",QueuedConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001f0304:
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::handleUnexpectedEOF()
{
    Q_ASSERT(reply);
    if (reconnectAttempts <= 0 || !request.methodIsIdempotent()) {
        // too many errors reading/receiving/parsing the status, close the socket and emit error
        requeueCurrentlyPipelinedRequests();
        close();
        reply->d_func()->errorString = connection->d_func()->errorDetail(QNetworkReply::RemoteHostClosedError, socket);
        emit reply->finishedWithError(QNetworkReply::RemoteHostClosedError, reply->d_func()->errorString);
        reply = nullptr;
        if (protocolHandler)
            protocolHandler->setReply(nullptr);
        request = QHttpNetworkRequest();
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        reconnectAttempts--;
        reply->d_func()->clear();
        reply->d_func()->connection = connection;
        reply->d_func()->connectionChannel = this;
        closeAndResendCurrentRequest();
    }
}